

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall
Assembler::processLdStrRegDir(Assembler *this,string *instruction,int reg,string operand)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)instruction);
  instr3Bytes(this,&sStack_38,reg,1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Assembler::processLdStrRegDir(string instruction, int reg, string operand) {
    int adr = 0x01;

    instr3Bytes(instruction, reg, adr);
    return;

}